

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Select.hpp
# Opt level: O1

Gen<char> * __thiscall
rc::gen::oneOf<char,char,char>
          (Gen<char> *__return_storage_ptr__,gen *this,Gen<char> *gen,Gen<char> *gens,
          Gen<char> *gens_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  IGenImpl *pIVar3;
  Gen<char> local_a0;
  Gen<char> local_78;
  Gen<char> local_50;
  OneOfGen<char> local_28;
  
  local_78.m_impl = *(IGenImpl **)this;
  local_78.m_name._M_dataplus._M_p = (pointer)&local_78.m_name.field_2;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(this + 0x18);
  if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)(this + 8) == paVar1) {
    local_78.m_name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_78.m_name.field_2._8_8_ = *(undefined8 *)(this + 0x20);
  }
  else {
    local_78.m_name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_78.m_name._M_dataplus._M_p =
         (pointer)*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)(this + 8);
  }
  local_78.m_name._M_string_length = *(size_type *)(this + 0x10);
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)(this + 8) = paVar1;
  *(undefined8 *)(this + 0x10) = 0;
  this[0x18] = (gen)0x0;
  *(undefined8 *)this = 0;
  local_a0.m_impl = gen->m_impl;
  local_a0.m_name._M_dataplus._M_p = (pointer)&local_a0.m_name.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(gen->m_name)._M_dataplus._M_p;
  paVar1 = &(gen->m_name).field_2;
  if (paVar2 == paVar1) {
    local_a0.m_name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_a0.m_name.field_2._8_8_ = *(undefined8 *)((long)&(gen->m_name).field_2 + 8);
  }
  else {
    local_a0.m_name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_a0.m_name._M_dataplus._M_p = (pointer)paVar2;
  }
  local_a0.m_name._M_string_length = (gen->m_name)._M_string_length;
  (gen->m_name)._M_dataplus._M_p = (pointer)paVar1;
  (gen->m_name)._M_string_length = 0;
  (gen->m_name).field_2._M_local_buf[0] = '\0';
  gen->m_impl = (IGenImpl *)0x0;
  local_50.m_impl = gens->m_impl;
  local_50.m_name._M_dataplus._M_p = (pointer)&local_50.m_name.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(gens->m_name)._M_dataplus._M_p;
  paVar1 = &(gens->m_name).field_2;
  if (paVar2 == paVar1) {
    local_50.m_name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_50.m_name.field_2._8_8_ = *(undefined8 *)((long)&(gens->m_name).field_2 + 8);
  }
  else {
    local_50.m_name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_50.m_name._M_dataplus._M_p = (pointer)paVar2;
  }
  local_50.m_name._M_string_length = (gens->m_name)._M_string_length;
  (gens->m_name)._M_dataplus._M_p = (pointer)paVar1;
  (gens->m_name)._M_string_length = 0;
  (gens->m_name).field_2._M_local_buf[0] = '\0';
  gens->m_impl = (IGenImpl *)0x0;
  detail::OneOfGen<char>::OneOfGen<char,char,char>(&local_28,&local_78,&local_a0,&local_50);
  pIVar3 = (IGenImpl *)operator_new(0x28);
  pIVar3->_vptr_IGenImpl = (_func_int **)&PTR_generate_001b3648;
  pIVar3[1]._vptr_IGenImpl =
       (_func_int **)
       local_28.m_gens.super__Vector_base<rc::Gen<char>,_std::allocator<rc::Gen<char>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  pIVar3[2]._vptr_IGenImpl =
       (_func_int **)
       local_28.m_gens.super__Vector_base<rc::Gen<char>,_std::allocator<rc::Gen<char>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  pIVar3[3]._vptr_IGenImpl =
       (_func_int **)
       local_28.m_gens.super__Vector_base<rc::Gen<char>,_std::allocator<rc::Gen<char>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_28.m_gens.super__Vector_base<rc::Gen<char>,_std::allocator<rc::Gen<char>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28.m_gens.super__Vector_base<rc::Gen<char>,_std::allocator<rc::Gen<char>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.m_gens.super__Vector_base<rc::Gen<char>,_std::allocator<rc::Gen<char>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pIVar3[4]._vptr_IGenImpl = (_func_int **)0x1;
  __return_storage_ptr__->m_impl = pIVar3;
  (__return_storage_ptr__->m_name)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_name).field_2;
  (__return_storage_ptr__->m_name)._M_string_length = 0;
  (__return_storage_ptr__->m_name).field_2._M_local_buf[0] = '\0';
  std::vector<rc::Gen<char>,_std::allocator<rc::Gen<char>_>_>::~vector(&local_28.m_gens);
  Gen<char>::~Gen(&local_50);
  Gen<char>::~Gen(&local_a0);
  Gen<char>::~Gen(&local_78);
  return __return_storage_ptr__;
}

Assistant:

Gen<T> oneOf(Gen<T> gen, Gen<Ts>... gens) {
  return detail::OneOfGen<T>(std::move(gen), std::move(gens)...);
}